

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O3

void __thiscall
QSortFilterProxyModelPrivate::source_items_inserted
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,int start,int end,
          Direction direction)

{
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  QObject *this_01;
  Span *pSVar1;
  long lVar2;
  long lVar3;
  Mapping *parent_mapping;
  QAbstractItemModel *pQVar4;
  Mapping *this_02;
  qsizetype qVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  Mapping *this_03;
  pointer piVar10;
  QList<int> *this_04;
  ulong uVar11;
  QList<int> *this_05;
  int i;
  int iVar12;
  uint source_row;
  long in_FS_OFFSET;
  const_iterator cVar13;
  QArrayData *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < (end | start)) {
    this_01 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
              super_QObjectPrivate.super_QObjectData.q_ptr;
    local_48.ptr = (source_parent->m).ptr;
    local_58 = *(QArrayData **)source_parent;
    puStack_50 = (undefined1 *)source_parent->i;
    cVar13 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
             constFindImpl<QtPrivate::QModelIndexWrapper>
                       (&this->source_index_mapping,(QModelIndexWrapper *)&local_58);
    if (cVar13.i.d ==
        (Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
         *)0x0 && cVar13.i.bucket == 0) {
      bVar6 = can_create_mapping(this,source_parent);
      if (bVar6) {
        cVar13 = create_mapping(this,source_parent);
        pSVar1 = (cVar13.i.d)->spans;
        uVar11 = cVar13.i.bucket >> 7;
        lVar2 = *(long *)(pSVar1[uVar11].entries
                          [pSVar1[uVar11].offsets[(uint)cVar13.i.bucket & 0x7f]].storage.data + 0x18
                         );
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        (*this_01->_vptr_QObject[0x33])(&local_58,this_01,source_parent);
        lVar3 = *(long *)(lVar2 + 0x10);
        if (lVar3 != 0) {
          QAbstractItemModel::beginInsertRows
                    ((QAbstractItemModel *)this_01,(QModelIndex *)&local_58,0,(int)lVar3 + -1);
          QAbstractItemModel::endInsertRows((QAbstractItemModel *)this_01);
        }
        lVar2 = *(long *)(lVar2 + 0x28);
        if (lVar2 != 0) {
          QAbstractItemModel::beginInsertColumns
                    ((QAbstractItemModel *)this_01,(QModelIndex *)&local_58,0,(int)lVar2 + -1);
          QAbstractItemModel::endInsertColumns((QAbstractItemModel *)this_01);
        }
      }
    }
    else {
      pSVar1 = (cVar13.i.d)->spans;
      uVar11 = cVar13.i.bucket >> 7;
      parent_mapping =
           *(Mapping **)
            (pSVar1[uVar11].entries[pSVar1[uVar11].offsets[(uint)cVar13.i.bucket & 0x7f]].storage.
             data + 0x18);
      this_05 = &parent_mapping->proxy_columns;
      if (direction == Rows) {
        this_05 = &parent_mapping->proxy_rows;
      }
      this_03 = (Mapping *)&parent_mapping->source_columns;
      if (direction == Rows) {
        this_03 = parent_mapping;
      }
      iVar12 = (end - start) + 1;
      qVar5 = (this_05->d).size;
      updateChildrenMapping(this,source_parent,parent_mapping,direction,start,end,iVar12,false);
      if ((ulong)(this_05->d).size < (ulong)(uint)start) {
        source_items_inserted();
      }
      else {
        if (iVar12 != 0) {
          QtPrivate::QPodArrayOps<int>::insert
                    ((QPodArrayOps<int> *)this_05,(ulong)(uint)start,(long)iVar12,-1);
        }
        QList<int>::begin(this_05);
        if (start < (int)qVar5) {
          uVar9 = (uint)(this_03->source_rows).d.size;
          if (0 < (int)uVar9) {
            uVar11 = 0;
            do {
              iVar8 = (this_03->source_rows).d.ptr[uVar11];
              if (start <= iVar8) {
                QList<int>::replace(&this_03->source_rows,uVar11,iVar8 + iVar12);
              }
              uVar11 = uVar11 + 1;
            } while ((uVar9 & 0x7fffffff) != uVar11);
          }
          QList<int>::fill(this_05,-1,-1);
          uVar9 = (uint)(this_03->source_rows).d.size;
          if (0 < (int)uVar9) {
            uVar11 = 0;
            do {
              iVar8 = (this_03->source_rows).d.ptr[uVar11];
              piVar10 = QList<int>::data(this_05);
              piVar10[iVar8] = (int)uVar11;
              uVar11 = uVar11 + 1;
            } while ((uVar9 & 0x7fffffff) != uVar11);
          }
        }
        local_58 = (QArrayData *)0x0;
        puStack_50 = (undefined1 *)0x0;
        local_48.ptr = (QAbstractItemModel *)0x0;
        if (start <= end) {
          do {
            if (direction == Rows) {
              cVar7 = filterAcceptsRowInternal(this,start,source_parent);
            }
            else {
              iVar8 = (*this_01->_vptr_QObject[0x37])(this_01,(ulong)(uint)start,source_parent);
              cVar7 = (char)iVar8;
            }
            if (cVar7 != '\0') {
              local_3c = start;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_58,(qsizetype)local_48.ptr,(int *)&local_3c);
              QList<int>::end((QList<int> *)&local_58);
            }
            start = start + 1;
          } while (end + 1U != start);
        }
        this_00 = &(this->super_QAbstractProxyModelPrivate).model;
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_00);
        pQVar4 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
        iVar8 = (*(pQVar4->super_QObject)._vptr_QObject[0xf])(pQVar4,source_parent);
        if (iVar8 == iVar12) {
          this_04 = &parent_mapping->proxy_columns;
          this_02 = (Mapping *)&parent_mapping->source_columns;
          if (direction == Columns) {
            this_04 = &parent_mapping->proxy_rows;
            this_02 = parent_mapping;
          }
          if ((this_04->d).size == 0) {
            QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
            ::value(this_00);
            pQVar4 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
            uVar9 = (*(pQVar4->super_QObject)._vptr_QObject[(ulong)(direction != Columns) + 0xf])
                              (pQVar4,source_parent);
            QList<int>::resize(this_04,(long)(int)uVar9);
            if (0 < (int)uVar9) {
              uVar11 = 0;
              do {
                source_row = (uint)uVar11;
                if (direction == Columns) {
                  cVar7 = filterAcceptsRowInternal(this,source_row,source_parent);
                }
                else {
                  iVar12 = (*this_01->_vptr_QObject[0x37])(this_01,uVar11,source_parent);
                  cVar7 = (char)iVar12;
                }
                if (cVar7 != '\0') {
                  local_3c = source_row;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)this_02,(this_02->source_rows).d.size,
                             (int *)&local_3c);
                  QList<int>::end(&this_02->source_rows);
                }
                uVar11 = (ulong)(source_row + 1);
              } while (uVar9 != source_row + 1);
            }
            if (direction == Columns) {
              sort_source_rows(this,&parent_mapping->source_rows,source_parent);
            }
            QList<int>::fill(this_04,-1,-1);
            uVar9 = (uint)(this_02->source_rows).d.size;
            if (0 < (int)uVar9) {
              uVar11 = 0;
              do {
                iVar12 = (this_02->source_rows).d.ptr[uVar11];
                piVar10 = QList<int>::data(this_04);
                piVar10[iVar12] = (int)uVar11;
                uVar11 = uVar11 + 1;
              } while ((uVar9 & 0x7fffffff) != uVar11);
            }
          }
        }
        if (direction == Rows) {
          sort_source_rows(this,(QList<int> *)&local_58,source_parent);
        }
        insert_source_items(this,this_05,&this_03->source_rows,(QList<int> *)&local_58,source_parent
                            ,direction,true);
        if (local_58 != (QArrayData *)0x0) {
          LOCK();
          (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_58,4,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::source_items_inserted(
    const QModelIndex &source_parent, int start, int end, Direction direction)
{
    Q_Q(QSortFilterProxyModel);
    if ((start < 0) || (end < 0))
        return;
    IndexMap::const_iterator it = source_index_mapping.constFind(source_parent);
    if (it == source_index_mapping.constEnd()) {
        if (!can_create_mapping(source_parent))
            return;
        it = create_mapping(source_parent);
        Mapping *m = it.value();
        QModelIndex proxy_parent = q->mapFromSource(source_parent);
        if (m->source_rows.size() > 0) {
            q->beginInsertRows(proxy_parent, 0, m->source_rows.size() - 1);
            q->endInsertRows();
        }
        if (m->source_columns.size() > 0) {
            q->beginInsertColumns(proxy_parent, 0, m->source_columns.size() - 1);
            q->endInsertColumns();
        }
        return;
    }

    Mapping *m = it.value();
    QList<int> &source_to_proxy = (direction == Direction::Rows) ? m->proxy_rows : m->proxy_columns;
    QList<int> &proxy_to_source = (direction == Direction::Rows) ? m->source_rows : m->source_columns;

    int delta_item_count = end - start + 1;
    int old_item_count = source_to_proxy.size();

    updateChildrenMapping(source_parent, m, direction, start, end, delta_item_count, false);

    // Expand source-to-proxy mapping to account for new items
    if (start < 0 || start > source_to_proxy.size()) {
        qWarning("QSortFilterProxyModel: invalid inserted rows reported by source model");
        remove_from_mapping(source_parent);
        return;
    }
    source_to_proxy.insert(start, delta_item_count, -1);

    if (start < old_item_count) {
        // Adjust existing "stale" indexes in proxy-to-source mapping
        int proxy_count = proxy_to_source.size();
        for (int proxy_item = 0; proxy_item < proxy_count; ++proxy_item) {
            int source_item = proxy_to_source.at(proxy_item);
            if (source_item >= start)
                proxy_to_source.replace(proxy_item, source_item + delta_item_count);
        }
        build_source_to_proxy_mapping(proxy_to_source, source_to_proxy);
    }

    // Figure out which items to add to mapping based on filter
    QList<int> source_items;
    for (int i = start; i <= end; ++i) {
        if ((direction == Direction::Rows)
            ? filterAcceptsRowInternal(i, source_parent)
            : q->filterAcceptsColumn(i, source_parent)) {
            source_items.append(i);
        }
    }

    if (model->rowCount(source_parent) == delta_item_count) {
        // Items were inserted where there were none before.
        // If it was new rows make sure to create mappings for columns so that a
        // valid mapping can be retrieved later and vice-versa.

        QList<int> &orthogonal_proxy_to_source = (direction == Direction::Columns) ? m->source_rows : m->source_columns;
        QList<int> &orthogonal_source_to_proxy = (direction == Direction::Columns) ? m->proxy_rows : m->proxy_columns;

        if (orthogonal_source_to_proxy.isEmpty()) {
            const int ortho_end = (direction == Direction::Columns) ? model->rowCount(source_parent) : model->columnCount(source_parent);

            orthogonal_source_to_proxy.resize(ortho_end);

            for (int ortho_item = 0; ortho_item < ortho_end; ++ortho_item) {
                if ((direction == Direction::Columns) ? filterAcceptsRowInternal(ortho_item, source_parent)
                        : q->filterAcceptsColumn(ortho_item, source_parent)) {
                    orthogonal_proxy_to_source.append(ortho_item);
                }
            }
            if (direction == Direction::Columns) {
                // We're reacting to columnsInserted, but we've just inserted new rows. Sort them.
                sort_source_rows(orthogonal_proxy_to_source, source_parent);
            }
            build_source_to_proxy_mapping(orthogonal_proxy_to_source, orthogonal_source_to_proxy);
        }
    }

    // Sort and insert the items
    if (direction == Direction::Rows) // Only sort rows
        sort_source_rows(source_items, source_parent);
    insert_source_items(source_to_proxy, proxy_to_source, source_items, source_parent, direction);
}